

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_vox.cpp
# Opt level: O1

ogt_vox_scene * load_vox_scene(char *filename,uint32_t scene_read_flags)

{
  FILE *__stream;
  ulong uVar1;
  uint8_t *buffer;
  ogt_vox_scene *poVar2;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    poVar2 = (ogt_vox_scene *)0x0;
  }
  else {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    buffer = (uint8_t *)operator_new__(uVar1 & 0xffffffff);
    fread(buffer,uVar1 & 0xffffffff,1,__stream);
    fclose(__stream);
    poVar2 = ogt_vox_read_scene_with_flags(buffer,(uint32_t)uVar1,scene_read_flags);
    operator_delete__(buffer);
  }
  return poVar2;
}

Assistant:

const ogt_vox_scene* load_vox_scene(const char* filename, uint32_t scene_read_flags = 0)
{
    // open the file
#if defined(_MSC_VER) && _MSC_VER >= 1400
    FILE * fp;
    if (0 != fopen_s(&fp, filename, "rb"))
        fp = 0;
#else
    FILE * fp = fopen(filename, "rb");
#endif
    if (!fp)
        return NULL;

    // get the buffer size which matches the size of the file
    fseek(fp, 0, SEEK_END);
    uint32_t buffer_size = ftell(fp);
    fseek(fp, 0, SEEK_SET);

    // load the file into a memory buffer
    uint8_t * buffer = new uint8_t[buffer_size];
    fread(buffer, buffer_size, 1, fp);
    fclose(fp);

    // construct the scene from the buffer
    const ogt_vox_scene * scene = ogt_vox_read_scene_with_flags(buffer, buffer_size, scene_read_flags);

    // the buffer can be safely deleted once the scene is instantiated.
    delete[] buffer;

    return scene;
}